

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  bool bVar1;
  Result result;
  Opcode OVar2;
  uint32_t local_34;
  Enum local_30;
  uint32_t code;
  char *pcStack_28;
  uint8_t value;
  char *desc_local;
  Opcode *out_value_local;
  BinaryReader *this_local;
  
  code._3_1_ = 0;
  pcStack_28 = desc;
  desc_local = (char *)out_value;
  out_value_local = (Opcode *)this;
  local_30 = (Enum)ReadU8(this,(uint8_t *)((long)&code + 3),desc);
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = Opcode::IsPrefixByte(code._3_1_);
    if (bVar1) {
      result = ReadU32Leb128(this,&local_34,pcStack_28);
      bVar1 = Failed(result);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      OVar2 = Opcode::FromCode(code._3_1_,local_34);
      *(Enum *)desc_local = OVar2.enum_;
    }
    else {
      OVar2 = Opcode::FromCode((uint)code._3_1_);
      *(Enum *)desc_local = OVar2.enum_;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}